

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_tri_node_angle(REF_NODE ref_node,REF_INT *nodes,REF_INT node,REF_DBL *angle)

{
  int iVar1;
  int iVar2;
  REF_DBL *pRVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  double dVar10;
  REF_DBL edge2 [3];
  REF_DBL edge1 [3];
  double local_48 [4];
  double local_28 [3];
  
  *angle = -9.0;
  iVar1 = *nodes;
  iVar2 = nodes[1];
  iVar4 = -1;
  iVar6 = -1;
  if (iVar1 == node) {
    iVar4 = nodes[2];
    iVar6 = iVar2;
  }
  if (iVar2 == node) {
    iVar6 = nodes[2];
    iVar4 = iVar1;
  }
  if (nodes[2] == node) {
    iVar6 = iVar1;
    iVar4 = iVar2;
  }
  uVar5 = 5;
  if ((iVar6 != -1) && (iVar4 != -1)) {
    pRVar3 = ref_node->real;
    lVar8 = 0;
    do {
      dVar10 = pRVar3[node * 0xf + lVar8];
      local_28[lVar8] = pRVar3[iVar6 * 0xf + lVar8] - dVar10;
      local_48[lVar8] = pRVar3[iVar4 * 0xf + lVar8] - dVar10;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    uVar5 = ref_math_normalize(local_28);
    if (uVar5 == 0) {
      uVar5 = ref_math_normalize(local_48);
      if (uVar5 == 0) {
        dVar10 = acos(local_28[2] * local_48[2] +
                      local_28[0] * local_48[0] + local_28[1] * local_48[1]);
        *angle = dVar10;
        return 0;
      }
      pcVar9 = "normalize zero length edge2";
      uVar7 = 0x926;
    }
    else {
      pcVar9 = "normalize zero length edge1";
      uVar7 = 0x925;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar7,
           "ref_node_tri_node_angle",(ulong)uVar5,pcVar9);
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_node_angle(REF_NODE ref_node, REF_INT *nodes,
                                           REF_INT node, REF_DBL *angle) {
  REF_INT node1, node2, i;
  REF_DBL edge1[3], edge2[3];

  *angle = -9.0;

  node1 = REF_EMPTY;
  node2 = REF_EMPTY;
  if (node == nodes[0]) {
    node1 = nodes[1];
    node2 = nodes[2];
  }
  if (node == nodes[1]) {
    node1 = nodes[2];
    node2 = nodes[0];
  }
  if (node == nodes[2]) {
    node1 = nodes[0];
    node2 = nodes[1];
  }
  if (REF_EMPTY == node1 || REF_EMPTY == node2) return REF_NOT_FOUND;

  for (i = 0; i < 3; i++) {
    edge1[i] =
        ref_node_xyz(ref_node, i, node1) - ref_node_xyz(ref_node, i, node);
    edge2[i] =
        ref_node_xyz(ref_node, i, node2) - ref_node_xyz(ref_node, i, node);
  }

  RSS(ref_math_normalize(edge1), "normalize zero length edge1");
  RSS(ref_math_normalize(edge2), "normalize zero length edge2");
  *angle = acos(ref_math_dot(edge1, edge2));

  return REF_SUCCESS;
}